

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

int __thiscall
Indexing::ClauseCodeTree::LiteralMatcher::init(LiteralMatcher *this,EVP_PKEY_CTX *ctx)

{
  CodeOp ***pppCVar1;
  ulong uVar2;
  CodeOp **ppCVar3;
  undefined7 extraout_var;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  size_t in_R8;
  int in_R9D;
  CodeOp *pCVar4;
  bool bVar5;
  
  CodeTree::Matcher::init(&this->super_Matcher,ctx);
  (this->super_Matcher).linfos = (LitInfo *)CONCAT71(in_register_00000009,in_CL);
  (this->super_Matcher).linfoCnt = in_R8;
  this->_eagerlyMatched = false;
  ppCVar3 = (this->eagerResults)._stack;
  (this->eagerResults)._cursor = ppCVar3;
  if (in_R9D != 0) {
    this->_eagerlyMatched = true;
    (this->super_Matcher)._fresh = false;
    pCVar4 = (this->super_Matcher).entry;
    if (pCVar4 != (CodeOp *)0x0) {
      do {
        uVar2 = pCVar4->_content;
        bVar5 = (uVar2 & 7) != 0;
        ppCVar3 = (CodeOp **)CONCAT71((int7)(uVar2 >> 8),uVar2 == 0 || bVar5);
        if (uVar2 != 0 && !bVar5) {
          if ((this->eagerResults)._cursor == (this->eagerResults)._end) {
            ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(&this->eagerResults);
          }
          ppCVar3 = (this->eagerResults)._cursor;
          *ppCVar3 = pCVar4;
          pppCVar1 = &(this->eagerResults)._cursor;
          *pppCVar1 = *pppCVar1 + 1;
        }
        pCVar4 = pCVar4->_alternative;
      } while (pCVar4 != (CodeOp *)0x0);
    }
    return (int)ppCVar3;
  }
  bVar5 = CodeTree::Matcher::prepareLiteral(&this->super_Matcher);
  return (int)CONCAT71(extraout_var,bVar5);
}

Assistant:

void ClauseCodeTree::LiteralMatcher::init(CodeTree* tree_, CodeOp* entry_,
					  LitInfo* linfos_, size_t linfoCnt_,
					  bool seekOnlySuccess)
{
  ASS_G(linfoCnt_,0);

  Matcher::init(tree_,entry_);

  linfos=linfos_;
  linfoCnt=linfoCnt_;

  _eagerlyMatched=false;
  eagerResults.reset();

  RSTAT_CTR_INC("LiteralMatcher::init");
  if(seekOnlySuccess) {
    RSTAT_CTR_INC("LiteralMatcher::init - seekOnlySuccess");
    //we are interested only in SUCCESS operations
    //(and those must be at the entry point or its alternatives)

    _eagerlyMatched=true;
    _fresh=false;
    CodeOp* sop=entry;
    while(sop) {
      if(sop->isSuccess()) {
	eagerResults.push(sop);
      }
      sop=sop->alternative();
    }
    return;
  }

  ALWAYS(prepareLiteral());
}